

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcesDictionary.cpp
# Opt level: O3

void __thiscall ResourcesDictionary::~ResourcesDictionary(ResourcesDictionary *this)

{
  ~ResourcesDictionary(this);
  operator_delete(this,0x1d0);
  return;
}

Assistant:

ResourcesDictionary::~ResourcesDictionary(void)
{
}